

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

int Llb_NonlinQuantify2(Llb_Mgr_t *p,Llb_Prt_t *pPart1,Llb_Prt_t *pPart2)

{
  int iVar1;
  DdNode *n;
  DdNode *n_00;
  Llb_Prt_t *pLVar2;
  Vec_Int_t *pVVar3;
  Llb_Var_t *pLVar4;
  Vec_Ptr_t *p_00;
  int local_64;
  int nSuppSize;
  int RetValue;
  int i;
  DdNode *bFunc;
  DdNode *bCube;
  Vec_Ptr_t *vSingles;
  Llb_Prt_t *pTemp;
  Llb_Var_t *pVar;
  int fVerbose;
  Llb_Prt_t *pPart2_local;
  Llb_Prt_t *pPart1_local;
  Llb_Mgr_t *p_local;
  
  n = Llb_NonlinCreateCube2(p,pPart1,pPart2);
  Cudd_Ref(n);
  n_00 = Cudd_bddAndAbstract(p->dd,pPart1->bFunc,pPart2->bFunc,n);
  if (n_00 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,n);
    p_local._4_4_ = 0;
  }
  else {
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(p->dd,n);
    pLVar2 = (Llb_Prt_t *)calloc(1,0x18);
    p->pParts[p->iPartFree] = pLVar2;
    iVar1 = p->iPartFree;
    p->iPartFree = iVar1 + 1;
    pLVar2->iPart = iVar1;
    iVar1 = Cudd_DagSize(n_00);
    pLVar2->nSize = iVar1;
    pLVar2->bFunc = n_00;
    pVVar3 = Vec_IntAlloc(8);
    pLVar2->vVars = pVVar3;
    for (nSuppSize = 0; iVar1 = Vec_IntSize(pPart1->vVars), nSuppSize < iVar1;
        nSuppSize = nSuppSize + 1) {
      iVar1 = Vec_IntEntry(pPart1->vVars,nSuppSize);
      pLVar4 = Llb_MgrVar(p,iVar1);
      iVar1 = Vec_IntRemove(pLVar4->vParts,pPart1->iPart);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Image.c"
                      ,0x194,"int Llb_NonlinQuantify2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)");
      }
      pLVar4->nScore = pLVar4->nScore - pPart1->nSize;
    }
    for (nSuppSize = 0; iVar1 = Vec_IntSize(pPart2->vVars), nSuppSize < iVar1;
        nSuppSize = nSuppSize + 1) {
      iVar1 = Vec_IntEntry(pPart2->vVars,nSuppSize);
      pLVar4 = Llb_MgrVar(p,iVar1);
      iVar1 = Vec_IntRemove(pLVar4->vParts,pPart2->iPart);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Image.c"
                      ,0x19b,"int Llb_NonlinQuantify2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)");
      }
      pLVar4->nScore = pLVar4->nScore - pPart2->nSize;
    }
    local_64 = 0;
    Extra_SupportArray(p->dd,n_00,p->pSupp);
    for (nSuppSize = 0; nSuppSize < p->nVars; nSuppSize = nSuppSize + 1) {
      local_64 = p->pSupp[nSuppSize] + local_64;
      if ((p->pSupp[nSuppSize] != 0) && (p->pVars2Q[nSuppSize] != 0)) {
        pLVar4 = Llb_MgrVar(p,nSuppSize);
        pLVar4->nScore = pLVar2->nSize + pLVar4->nScore;
        Vec_IntPush(pLVar4->vParts,pLVar2->iPart);
        Vec_IntPush(pLVar2->vVars,nSuppSize);
      }
    }
    iVar1 = Abc_MaxInt(p->nSuppMax,local_64);
    p->nSuppMax = iVar1;
    p_00 = Vec_PtrAlloc(0);
    for (nSuppSize = 0; iVar1 = Vec_IntSize(pPart1->vVars), nSuppSize < iVar1;
        nSuppSize = nSuppSize + 1) {
      iVar1 = Vec_IntEntry(pPart1->vVars,nSuppSize);
      pLVar4 = Llb_MgrVar(p,iVar1);
      iVar1 = Vec_IntSize(pLVar4->vParts);
      if (iVar1 == 0) {
        Llb_NonlinRemoveVar(p,pLVar4);
      }
      else {
        iVar1 = Vec_IntSize(pLVar4->vParts);
        if (iVar1 == 1) {
          iVar1 = Vec_IntEntry(pLVar4->vParts,0);
          pLVar2 = Llb_MgrPart(p,iVar1);
          Vec_PtrPushUnique(p_00,pLVar2);
        }
      }
    }
    for (nSuppSize = 0; iVar1 = Vec_IntSize(pPart2->vVars), nSuppSize < iVar1;
        nSuppSize = nSuppSize + 1) {
      iVar1 = Vec_IntEntry(pPart2->vVars,nSuppSize);
      pLVar4 = Llb_MgrVar(p,iVar1);
      if (pLVar4 != (Llb_Var_t *)0x0) {
        iVar1 = Vec_IntSize(pLVar4->vParts);
        if (iVar1 == 0) {
          Llb_NonlinRemoveVar(p,pLVar4);
        }
        else {
          iVar1 = Vec_IntSize(pLVar4->vParts);
          if (iVar1 == 1) {
            iVar1 = Vec_IntEntry(pLVar4->vParts,0);
            pLVar2 = Llb_MgrPart(p,iVar1);
            Vec_PtrPushUnique(p_00,pLVar2);
          }
        }
      }
    }
    Llb_NonlinRemovePart(p,pPart1);
    Llb_NonlinRemovePart(p,pPart2);
    for (nSuppSize = 0; iVar1 = Vec_PtrSize(p_00), nSuppSize < iVar1; nSuppSize = nSuppSize + 1) {
      pLVar2 = (Llb_Prt_t *)Vec_PtrEntry(p_00,nSuppSize);
      Llb_NonlinQuantify1(p,pLVar2,0);
    }
    Vec_PtrFree(p_00);
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Llb_NonlinQuantify2( Llb_Mgr_t * p, Llb_Prt_t * pPart1, Llb_Prt_t * pPart2 )
{
    int fVerbose = 0;
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bFunc;
    int i, RetValue, nSuppSize;
//    int iPart1 = pPart1->iPart;
//    int iPart2 = pPart2->iPart;

    // create cube to be quantified
    bCube = Llb_NonlinCreateCube2( p, pPart1, pPart2 );   Cudd_Ref( bCube );
if ( fVerbose )
{
printf( "\n" );
printf( "\n" );
Llb_NonlinPrint( p );
printf( "Conjoining partitions %d and %d.\n", pPart1->iPart, pPart2->iPart );
Extra_bddPrintSupport( p->dd, bCube );  printf( "\n" );
}
 
    // derive new function
//    bFunc = Cudd_bddAndAbstract( p->dd, pPart1->bFunc, pPart2->bFunc, bCube );  Cudd_Ref( bFunc );
/*
    bFunc = Cudd_bddAndAbstractLimit( p->dd, pPart1->bFunc, pPart2->bFunc, bCube, Limit );  
    if ( bFunc == NULL )
    {
        int RetValue;
        Cudd_RecursiveDeref( p->dd, bCube );
        if ( pPart1->nSize < pPart2->nSize )
            RetValue = Llb_NonlinQuantify1( p, pPart1, 1 );
        else
            RetValue = Llb_NonlinQuantify1( p, pPart2, 1 );
        if ( RetValue )
            Limit = Limit + 1000;
        Llb_NonlinQuantify2( p, pPart1, pPart2 );
        return 0;
    }
    Cudd_Ref( bFunc );
*/

//    bFunc = Extra_bddAndAbstractTime( p->dd, pPart1->bFunc, pPart2->bFunc, bCube, TimeOut );  
    bFunc = Cudd_bddAndAbstract( p->dd, pPart1->bFunc, pPart2->bFunc, bCube );  
    if ( bFunc == NULL )
    {
        Cudd_RecursiveDeref( p->dd, bCube );
        return 0;
    }
    Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( p->dd, bCube );

    // create new partition
    pTemp = p->pParts[p->iPartFree] = ABC_CALLOC( Llb_Prt_t, 1 );
    pTemp->iPart = p->iPartFree++;
    pTemp->nSize = Cudd_DagSize(bFunc);
    pTemp->bFunc = bFunc;
    pTemp->vVars = Vec_IntAlloc( 8 );
    // update variables
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        RetValue = Vec_IntRemove( pVar->vParts, pPart1->iPart );
        assert( RetValue );
        pVar->nScore -= pPart1->nSize;
    }
    // update variables
    Llb_PartForEachVar( p, pPart2, pVar, i )
    {
        RetValue = Vec_IntRemove( pVar->vParts, pPart2->iPart );
        assert( RetValue );
        pVar->nScore -= pPart2->nSize;
    }
    // add variables to the new partition
    nSuppSize = 0;
    Extra_SupportArray( p->dd, bFunc, p->pSupp );
    for ( i = 0; i < p->nVars; i++ )
    {
        nSuppSize += p->pSupp[i];
        if ( p->pSupp[i] && p->pVars2Q[i] )
        {
            pVar = Llb_MgrVar( p, i );
            pVar->nScore += pTemp->nSize;
            Vec_IntPush( pVar->vParts, pTemp->iPart );
            Vec_IntPush( pTemp->vVars, i );
        }
    }
    p->nSuppMax = Abc_MaxInt( p->nSuppMax, nSuppSize ); 
    // remove variables and collect partitions with singleton variables
    vSingles = Vec_PtrAlloc( 0 );
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        if ( Vec_IntSize(pVar->vParts) == 0 )
            Llb_NonlinRemoveVar( p, pVar );
        else if ( Vec_IntSize(pVar->vParts) == 1 )
        {
            if ( fVerbose )
                printf( "Adding partition %d because of var %d.\n", 
                    Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0))->iPart, pVar->iVar );
            Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }
    }
    Llb_PartForEachVar( p, pPart2, pVar, i )
    {
        if ( pVar == NULL )
            continue;
        if ( Vec_IntSize(pVar->vParts) == 0 )
            Llb_NonlinRemoveVar( p, pVar );
        else if ( Vec_IntSize(pVar->vParts) == 1 )
        {
            if ( fVerbose )
                printf( "Adding partition %d because of var %d.\n", 
                    Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0))->iPart, pVar->iVar );
            Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }
    }
    // remove partitions
    Llb_NonlinRemovePart( p, pPart1 );
    Llb_NonlinRemovePart( p, pPart2 );
    // remove other variables
if ( fVerbose )
Llb_NonlinPrint( p );
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
    {
if ( fVerbose )
printf( "Updating partitiong %d with singlton vars.\n", pTemp->iPart );
        Llb_NonlinQuantify1( p, pTemp, 0 );
    }
if ( fVerbose )
Llb_NonlinPrint( p );
    Vec_PtrFree( vSingles );
    return 1;
}